

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

void render_open_td_block(MD_HTML *r,MD_CHAR *cell_type,MD_BLOCK_TD_DETAIL *det)

{
  MD_ALIGN MVar1;
  size_t sVar2;
  MD_SIZE MVar3;
  char *pcVar4;
  
  (*r->process_output)("<",1,r->userdata);
  sVar2 = strlen(cell_type);
  (*r->process_output)(cell_type,(MD_SIZE)sVar2,r->userdata);
  MVar1 = det->align;
  if (MVar1 == MD_ALIGN_RIGHT) {
    pcVar4 = " align=\"right\">";
    MVar3 = 0xf;
  }
  else if (MVar1 == MD_ALIGN_CENTER) {
    pcVar4 = " align=\"center\">";
    MVar3 = 0x10;
  }
  else if (MVar1 == MD_ALIGN_LEFT) {
    pcVar4 = " align=\"left\">";
    MVar3 = 0xe;
  }
  else {
    pcVar4 = ">";
    MVar3 = 1;
  }
  (*r->process_output)(pcVar4,MVar3,r->userdata);
  return;
}

Assistant:

static void
render_open_td_block(MD_HTML* r, const MD_CHAR* cell_type, const MD_BLOCK_TD_DETAIL* det)
{
    RENDER_VERBATIM(r, "<");
    RENDER_VERBATIM(r, cell_type);

    switch(det->align) {
        case MD_ALIGN_LEFT:     RENDER_VERBATIM(r, " align=\"left\">"); break;
        case MD_ALIGN_CENTER:   RENDER_VERBATIM(r, " align=\"center\">"); break;
        case MD_ALIGN_RIGHT:    RENDER_VERBATIM(r, " align=\"right\">"); break;
        default:                RENDER_VERBATIM(r, ">"); break;
    }
}